

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::IstreamInputStream::CopyingIstreamInputStream::Read
          (CopyingIstreamInputStream *this,void *buffer,int size)

{
  ulong uVar1;
  int result;
  int size_local;
  void *buffer_local;
  CopyingIstreamInputStream *this_local;
  
  std::istream::read((char *)this->input_,(long)buffer);
  this_local._4_4_ = std::istream::gcount();
  if (((this_local._4_4_ == 0) && (uVar1 = std::ios::fail(), (uVar1 & 1) != 0)) &&
     (uVar1 = std::ios::eof(), (uVar1 & 1) == 0)) {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int IstreamInputStream::CopyingIstreamInputStream::Read(void* buffer,
                                                        int size) {
  input_->read(reinterpret_cast<char*>(buffer), size);
  int result = input_->gcount();
  if (result == 0 && input_->fail() && !input_->eof()) {
    return -1;
  }
  return result;
}